

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O2

void cmn(cmn_t *cmn,mfcc_t **mfc,int32 varnorm,int32 n_frame)

{
  uint uVar1;
  float *pfVar2;
  mfcc_t *pmVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  
  if (mfc == (mfcc_t **)0x0) {
    __assert_fail("mfc != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
                  ,0x6b,"void cmn(cmn_t *, mfcc_t **, int32, int32)");
  }
  if (0 < n_frame) {
    memset(cmn->cmn_mean,0,(long)cmn->veclen << 2);
    uVar9 = (ulong)(uint)n_frame;
    iVar4 = 0;
    for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      pfVar2 = (float *)mfc[uVar5];
      if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
        uVar6 = (ulong)(uint)cmn->veclen;
        if (cmn->veclen < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          cmn->cmn_mean[uVar8] = (mfcc_t)(pfVar2[uVar8] + (float)cmn->cmn_mean[uVar8]);
        }
        iVar4 = iVar4 + 1;
      }
    }
    uVar5 = 0;
    uVar6 = (ulong)(uint)cmn->veclen;
    if (cmn->veclen < 1) {
      uVar6 = 0;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      cmn->cmn_mean[uVar5] = (mfcc_t)((float)cmn->cmn_mean[uVar5] / (float)iVar4);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
            ,0x85,"CMN: ");
    for (lVar7 = 0; lVar7 < cmn->veclen; lVar7 = lVar7 + 1) {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar7]);
    }
    uVar5 = 0;
    err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
    if (varnorm == 0) {
      uVar6 = (ulong)(uint)cmn->veclen;
      if (cmn->veclen < 1) {
        uVar6 = uVar5;
      }
      for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
        pmVar3 = mfc[uVar5];
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          pmVar3[uVar8] = (mfcc_t)((float)pmVar3[uVar8] - (float)cmn->cmn_mean[uVar8]);
        }
      }
    }
    else {
      memset(cmn->cmn_var,0,(long)cmn->veclen << 2);
      uVar6 = (ulong)(uint)cmn->veclen;
      if (cmn->veclen < 1) {
        uVar6 = uVar5;
      }
      for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
        pmVar3 = mfc[uVar5];
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          fVar10 = (float)pmVar3[uVar8] - (float)cmn->cmn_mean[uVar8];
          cmn->cmn_var[uVar8] = (mfcc_t)(fVar10 * fVar10 + (float)cmn->cmn_var[uVar8]);
        }
      }
      for (lVar7 = 0; uVar1 = cmn->veclen, lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
        dVar11 = (double)n_frame / (double)(float)cmn->cmn_var[lVar7];
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        cmn->cmn_var[lVar7] = (mfcc_t)(float)dVar11;
      }
      uVar6 = 0;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar6;
      }
      for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
        pmVar3 = mfc[uVar6];
        for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
          pmVar3[uVar8] =
               (mfcc_t)(((float)pmVar3[uVar8] - (float)cmn->cmn_mean[uVar8]) *
                       (float)cmn->cmn_var[uVar8]);
        }
      }
    }
  }
  return;
}

Assistant:

void
cmn(cmn_t *cmn, mfcc_t ** mfc, int32 varnorm, int32 n_frame)
{
    mfcc_t *mfcp;
    mfcc_t t;
    int32 i, f;
    int32 n_pos_frame;

    assert(mfc != NULL);

    if (n_frame <= 0)
        return;

    /* If cmn->cmn_mean wasn't NULL, we need to zero the contents */
    memset(cmn->cmn_mean, 0, cmn->veclen * sizeof(mfcc_t));

    /* Find mean cep vector for this utterance */
    for (f = 0, n_pos_frame = 0; f < n_frame; f++) {
        mfcp = mfc[f];

        /* Skip zero energy frames */
        if (mfcp[0] < 0)
    	    continue;

        for (i = 0; i < cmn->veclen; i++) {
            cmn->cmn_mean[i] += mfcp[i];
        }

        n_pos_frame++;
    }

    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] /= n_pos_frame;

    E_INFO("CMN: ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT("\n");
    if (!varnorm) {
        /* Subtract mean from each cep vector */
        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];
            for (i = 0; i < cmn->veclen; i++)
                mfcp[i] -= cmn->cmn_mean[i];
        }
    }
    else {
        /* Scale cep vectors to have unit variance along each dimension, and subtract means */
        /* If cmn->cmn_var wasn't NULL, we need to zero the contents */
        memset(cmn->cmn_var, 0, cmn->veclen * sizeof(mfcc_t));

        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];

            for (i = 0; i < cmn->veclen; i++) {
                t = mfcp[i] - cmn->cmn_mean[i];
                cmn->cmn_var[i] += MFCCMUL(t, t);
            }
        }
        for (i = 0; i < cmn->veclen; i++)
            /* Inverse Std. Dev, RAH added type case from sqrt */
            cmn->cmn_var[i] = FLOAT2MFCC(sqrt((float64)n_frame / MFCC2FLOAT(cmn->cmn_var[i])));

        for (f = 0; f < n_frame; f++) {
            mfcp = mfc[f];
            for (i = 0; i < cmn->veclen; i++)
                mfcp[i] = MFCCMUL((mfcp[i] - cmn->cmn_mean[i]), cmn->cmn_var[i]);
        }
    }
}